

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaMappingHysteresis::PostUnmap(VmaMappingHysteresis *this)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  
  if (this->m_ExtraMapping == 0) {
    this->m_MajorCounter = this->m_MajorCounter + 1;
    return;
  }
  uVar1 = this->m_MinorCounter;
  uVar2 = this->m_MajorCounter;
  if (uVar1 < uVar2) {
    uVar3 = uVar1 + 1;
  }
  else {
    if (uVar2 == 0) {
      return;
    }
    this->m_MajorCounter = uVar2 - 1;
    uVar3 = uVar1 - 1;
  }
  this->m_MinorCounter = uVar3;
  return;
}

Assistant:

void PostUnmap()
    {
#if VMA_MAPPING_HYSTERESIS_ENABLED
        if(m_ExtraMapping == 0)
            ++m_MajorCounter;
        else // m_ExtraMapping == 1
            PostMinorCounter();
#endif // #if VMA_MAPPING_HYSTERESIS_ENABLED
    }